

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  iterator __position;
  Snapshot snapshot;
  cmMakefile *this_00;
  bool bVar2;
  cmLocalGenerator *lg;
  cmMakefile *subMf;
  Snapshot newSnapshot;
  cmMakefile *local_70;
  string local_68;
  Snapshot local_48;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar2) {
    cmState::CreateBuildsystemDirectorySnapshot
              (&local_48,this->LocalGenerator->GlobalGenerator->CMakeInstance->State,
               this->StateSnapshot);
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    lg = cmGlobalGenerator::MakeLocalGenerator
                   (this->LocalGenerator->GlobalGenerator,snapshot,this->LocalGenerator);
    cmGlobalGenerator::AddLocalGenerator(this->LocalGenerator->GlobalGenerator,lg);
    local_70 = lg->Makefile;
    SetCurrentSourceDirectory(local_70,srcPath);
    SetCurrentBinaryDirectory(local_70,binPath);
    this_00 = local_70;
    if (excludeFromAll) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"EXCLUDE_FROM_ALL","");
      SetProperty(this_00,&local_68,"TRUE");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if (immediate) {
      ConfigureSubDirectory(this,local_70);
    }
    else {
      __position._M_current =
           (this->UnConfiguredDirectories).
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UnConfiguredDirectories).
          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories
                   ,__position,&local_70);
      }
      else {
        *__position._M_current = local_70;
        pppcVar1 = &(this->UnConfiguredDirectories).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  // create a new local generator and set its parent
  cmLocalGenerator *lg2 = this->GetGlobalGenerator()
        ->MakeLocalGenerator(newSnapshot, this->LocalGenerator);
  this->GetGlobalGenerator()->AddLocalGenerator(lg2);

  cmMakefile* subMf = lg2->GetMakefile();

  // set the subdirs start dirs
  subMf->SetCurrentSourceDirectory(srcPath);
  subMf->SetCurrentBinaryDirectory(binPath);
  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}